

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O0

Status __thiscall spvtools::opt::Pass::Run(Pass *this,IRContext *ctx)

{
  bool bVar1;
  Analysis preserved_analyses;
  Status status;
  IRContext *ctx_local;
  Pass *this_local;
  
  if ((this->already_run_ & 1U) == 0) {
    this->already_run_ = true;
    this->context_ = ctx;
    this_local._4_4_ = (*this->_vptr_Pass[4])();
    this->context_ = (IRContext *)0x0;
    if (this_local._4_4_ == SuccessWithChange) {
      preserved_analyses = (*this->_vptr_Pass[3])();
      IRContext::InvalidateAnalysesExceptFor(ctx,preserved_analyses);
    }
    if ((this_local._4_4_ != Failure) && (bVar1 = IRContext::IsConsistent(ctx), !bVar1)) {
      __assert_fail("false && \"An analysis in the context is out of date.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/pass.cpp"
                    ,0x2c,"Pass::Status spvtools::opt::Pass::Run(IRContext *)");
    }
  }
  else {
    this_local._4_4_ = Failure;
  }
  return this_local._4_4_;
}

Assistant:

Pass::Status Pass::Run(IRContext* ctx) {
  if (already_run_) {
    return Status::Failure;
  }
  already_run_ = true;

  context_ = ctx;
  Pass::Status status = Process();
  context_ = nullptr;

  if (status == Status::SuccessWithChange) {
    ctx->InvalidateAnalysesExceptFor(GetPreservedAnalyses());
  }
  if (!(status == Status::Failure || ctx->IsConsistent()))
    assert(false && "An analysis in the context is out of date.");
  return status;
}